

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

void __thiscall tcu::ThreadUtil::Thread::~Thread(Thread *this)

{
  pointer puVar1;
  pointer ppOVar2;
  pointer ppOVar3;
  long lVar4;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_02181cf8;
  ppOVar2 = (this->m_operations).
            super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar3 = (this->m_operations).
            super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppOVar3 - (long)ppOVar2) >> 3)) {
    lVar4 = 0;
    do {
      if (ppOVar2[lVar4] != (Operation *)0x0) {
        (*ppOVar2[lVar4]->_vptr_Operation[1])();
        ppOVar2 = (this->m_operations).
                  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppOVar3 = (this->m_operations).
                  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)ppOVar3 - (long)ppOVar2) >> 3));
  }
  if (ppOVar3 != ppOVar2) {
    (this->m_operations).
    super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppOVar2;
  }
  puVar1 = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_dummyData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::~vector
            (&this->m_messages);
  de::Mutex::~Mutex(&this->m_messageLock);
  ppOVar2 = (this->m_operations).
            super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar2 != (pointer)0x0) {
    operator_delete(ppOVar2,(long)(this->m_operations).
                                  super__Vector_base<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar2
                   );
  }
  de::Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Thread::~Thread (void)
{
	for (int operationNdx = 0; operationNdx < (int)m_operations.size(); operationNdx++)
		delete m_operations[operationNdx];

	m_operations.clear();
}